

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void expandFormatArguments<int,int>
               (vector<String,_std::allocator<String>_> *data,int *arg,int *rest)

{
  value_type vStack_38;
  
  FormatArgument::FormatArgument<int>((FormatArgument *)&vStack_38,arg);
  std::vector<String,_std::allocator<String>_>::push_back(data,&vStack_38);
  std::__cxx11::string::~string((string *)&vStack_38);
  expandFormatArguments<int>(data,rest);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}